

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_anewarray(ExecutionEngine *this)

{
  cp_info *constantPool;
  bool bVar1;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar2;
  u1 *puVar3;
  ulong uVar4;
  char *pcVar5;
  MethodArea *this_02;
  anon_union_8_10_52016fac_for_data this_03;
  ostream *poVar6;
  anon_union_8_10_52016fac_for_data aVar7;
  long lVar8;
  int iVar9;
  Value VVar10;
  string local_60;
  string className;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar10 = Frame::popTopOfOperandStack(this_01);
  aVar7 = VVar10.data;
  if (VVar10.type != INT) {
    __assert_fail("count.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x112e,"void ExecutionEngine::i_anewarray()");
  }
  if (-1 < VVar10.data._0_4_) {
    ppcVar2 = Frame::getConstantPool(this_01);
    constantPool = *ppcVar2;
    puVar3 = Frame::getCode(this_01,this_01->pc);
    uVar4 = (ulong)(ushort)(*(ushort *)(puVar3 + 1) << 8 | *(ushort *)(puVar3 + 1) >> 8);
    if (constantPool[uVar4 - 1].tag == '\a') {
      pcVar5 = getFormattedConstant
                         (constantPool,constantPool[uVar4 - 1].info.fieldref_info.class_index);
      std::__cxx11::string::string((string *)&className,pcVar5,(allocator *)&local_60);
      bVar1 = std::operator!=(&className,"java/lang/String");
      if (bVar1) {
        for (lVar8 = 2; className._M_dataplus._M_p[lVar8 + -2] == '['; lVar8 = lVar8 + 1) {
        }
        if (className._M_dataplus._M_p[lVar8 + -2] == 'L') {
          this_02 = MethodArea::getInstance();
          std::__cxx11::string::substr((ulong)&local_60,(ulong)&className);
          MethodArea::loadClassNamed(this_02,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
        }
      }
      this_03.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)this_03.object,REFERENCE);
      while (iVar9 = aVar7.intValue, aVar7._0_4_ = iVar9 - 1, aVar7.longValue._4_4_ = 0, iVar9 != 0)
      {
        ArrayObject::pushValue((ArrayObject *)this_03.object,(Value)ZEXT816(0x900000000));
      }
      VVar10.data.object = (Object *)this_03.longValue;
      VVar10.printType = BOOLEAN;
      VVar10.type = REFERENCE;
      Frame::pushIntoOperandStack(this_01,VVar10);
      this_01->pc = this_01->pc + 3;
      std::__cxx11::string::~string((string *)&className);
      return;
    }
    __assert_fail("classCP.tag == CONSTANT_Class",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x113b,"void ExecutionEngine::i_anewarray()");
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"NegativeArraySizeException");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(1);
}

Assistant:

void ExecutionEngine::i_anewarray() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value count = topFrame->popTopOfOperandStack(); // Número de elementos no array
    assert(count.type == ValueType::INT);
    if (count.data.intValue < 0) {
        cerr << "NegativeArraySizeException" << endl;
        exit(1);
    }
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t classIndex = (byte1 << 8) | byte2; // Índice na pool de constantes
    cp_info classCP = constantPool[classIndex-1];
    assert(classCP.tag == CONSTANT_Class);
    
    CONSTANT_Class_info classInfo = classCP.info.class_info; // Formata nome da classe
    string className = getFormattedConstant(constantPool, classInfo.name_index);

    if (className != "java/lang/String") {
        int i = 0;
        while (className[i] == '[') i++;
        if (className[i] == 'L') {
            MethodArea &methodArea = MethodArea::getInstance();
            methodArea.loadClassNamed(className.substr(i+1, className.size()-i-2)); // carrega a classe de referência (se ainda não foi).
        }
    }

    // criando objeto da classe instanciada
    Value objectref;
    objectref.type = ValueType::REFERENCE;
    objectref.data.object = new ArrayObject(ValueType::REFERENCE);
    
    // populando array com NULL
    Value nullValue;
    nullValue.type = ValueType::REFERENCE;
    nullValue.data.object = NULL;
    for (int i = 0; i < count.data.intValue; i++) {
        ((ArrayObject *) objectref.data.object)->pushValue(nullValue);
    }

    topFrame->pushIntoOperandStack(objectref);
    
    topFrame->pc += 3;
}